

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::VerifySignature(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
  local_58;
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::VerifySignatureResponseStruct(cfd::js::api::VerifySignatureRequestStruct_const&)>
  ::
  function<cfd::js::api::VerifySignatureResponseStruct(&)(cfd::js::api::VerifySignatureRequestStruct_const&),void>
            ((function<cfd::js::api::VerifySignatureResponseStruct(cfd::js::api::VerifySignatureRequestStruct_const&)>
              *)&local_38,TransactionStructApi::VerifySignature);
  std::
  function<cfd::js::api::VerifySignatureResponseStruct(cfd::js::api::VerifySignatureRequestStruct_const&)>
  ::
  function<cfd::js::api::VerifySignatureResponseStruct(&)(cfd::js::api::VerifySignatureRequestStruct_const&),void>
            ((function<cfd::js::api::VerifySignatureResponseStruct(cfd::js::api::VerifySignatureRequestStruct_const&)>
              *)&local_58,ElementsTransactionStructApi::VerifySignature);
  ExecuteElementsCheckApi<cfd::js::api::json::VerifySignatureRequest,cfd::js::api::json::VerifySignatureResponse,cfd::js::api::VerifySignatureRequestStruct,cfd::js::api::VerifySignatureResponseStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifySignatureRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::VerifySignature(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::VerifySignatureRequest, api::json::VerifySignatureResponse,
      api::VerifySignatureRequestStruct, api::VerifySignatureResponseStruct>(
      request_message, TransactionStructApi::VerifySignature,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::VerifySignature);
#else
      TransactionStructApi::VerifySignature);
#endif
}